

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall
NNTreeImpl::NNTreeImpl
          (NNTreeImpl *this,NNTreeDetails *details,QPDF *qpdf,QPDFObjectHandle *oh,bool auto_repair)

{
  this->details = details;
  this->qpdf = qpdf;
  this->split_threshold = 0x20;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->oh,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
  this->auto_repair = auto_repair;
  return;
}

Assistant:

NNTreeImpl::NNTreeImpl(
    NNTreeDetails const& details, QPDF& qpdf, QPDFObjectHandle& oh, bool auto_repair) :
    details(details),
    qpdf(qpdf),
    split_threshold(32),
    oh(oh),
    auto_repair(auto_repair)
{
}